

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

double __thiscall dlib::cpu::tanh(cpu *this,double __x)

{
  long lVar1;
  long lVar2;
  long *in_RSI;
  size_t i;
  ulong uVar3;
  float extraout_XMM0_Da;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db_00;
  
  lVar1 = (**(code **)(*(long *)this + 0x18))(SUB84(__x,0));
  lVar2 = (**(code **)(*in_RSI + 0x10))();
  fVar4 = extraout_XMM0_Da;
  uVar5 = extraout_XMM0_Db;
  for (uVar3 = 0; uVar3 < (ulong)in_RSI[5]; uVar3 = uVar3 + 1) {
    fVar4 = tanhf(*(float *)(lVar2 + uVar3 * 4));
    *(float *)(lVar1 + uVar3 * 4) = fVar4;
    uVar5 = extraout_XMM0_Db_00;
  }
  return (double)CONCAT44(uVar5,fVar4);
}

Assistant:

void tanh (
            tensor& dest,
            const tensor& src
        )
        {
            const auto d = dest.host();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
                d[i] = std::tanh(s[i]);
        }